

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaClearAttrInfos(xmlSchemaValidCtxtPtr vctxt)

{
  int iVar1;
  xmlSchemaAttrInfoPtr pxVar2;
  long lVar3;
  
  iVar1 = vctxt->nbAttrInfos;
  if (iVar1 != 0) {
    for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
      pxVar2 = vctxt->attrInfos[lVar3];
      if ((pxVar2->flags & 1) != 0) {
        if (pxVar2->localName != (xmlChar *)0x0) {
          (*xmlFree)(pxVar2->localName);
        }
        if (pxVar2->nsName != (xmlChar *)0x0) {
          (*xmlFree)(pxVar2->nsName);
        }
      }
      if (((pxVar2->flags & 2) != 0) && (pxVar2->value != (xmlChar *)0x0)) {
        (*xmlFree)(pxVar2->value);
      }
      if (pxVar2->val != (xmlSchemaValPtr)0x0) {
        xmlSchemaFreeValue(pxVar2->val);
      }
      pxVar2->vcValue = (xmlChar *)0x0;
      pxVar2->parent = (xmlSchemaNodeInfoPtr)0x0;
      pxVar2->use = (xmlSchemaAttributeUsePtr_conflict)0x0;
      pxVar2->state = 0;
      pxVar2->metaType = 0;
      *(undefined8 *)&pxVar2->flags = 0;
      pxVar2->decl = (xmlSchemaAttributePtr)0x0;
      pxVar2->val = (xmlSchemaValPtr)0x0;
      pxVar2->typeDef = (xmlSchemaTypePtr)0x0;
      pxVar2->nsName = (xmlChar *)0x0;
      pxVar2->value = (xmlChar *)0x0;
      *(undefined8 *)&pxVar2->nodeLine = 0;
      pxVar2->localName = (xmlChar *)0x0;
      *(undefined8 *)pxVar2 = 0;
      pxVar2->node = (xmlNodePtr)0x0;
      iVar1 = vctxt->nbAttrInfos;
    }
    vctxt->nbAttrInfos = 0;
  }
  return;
}

Assistant:

static void
xmlSchemaClearAttrInfos(xmlSchemaValidCtxtPtr vctxt)
{
    int i;
    xmlSchemaAttrInfoPtr attr;

    if (vctxt->nbAttrInfos == 0)
	return;
    for (i = 0; i < vctxt->nbAttrInfos; i++) {
	attr = vctxt->attrInfos[i];
	if (attr->flags & XML_SCHEMA_NODE_INFO_FLAG_OWNED_NAMES) {
	    if (attr->localName != NULL)
		xmlFree((xmlChar *) attr->localName);
	    if (attr->nsName != NULL)
		xmlFree((xmlChar *) attr->nsName);
	}
	if (attr->flags & XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES) {
	    if (attr->value != NULL)
		xmlFree((xmlChar *) attr->value);
	}
	if (attr->val != NULL) {
	    xmlSchemaFreeValue(attr->val);
	    attr->val = NULL;
	}
	memset(attr, 0, sizeof(xmlSchemaAttrInfo));
    }
    vctxt->nbAttrInfos = 0;
}